

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::QueryRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,QueryRelation *this,idx_t depth)

{
  string local_30;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_30,(Relation *)depth,depth);
  ::std::operator+(__return_storage_ptr__,&local_30,"Subquery");
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string QueryRelation::ToString(idx_t depth) {
	return RenderWhitespace(depth) + "Subquery";
}